

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

int ConvertToDoubleMT(int OutputSettings,uchar *buf,int offset,double *pValue)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  
  switch((uint)OutputSettings >> 8 & 3) {
  case 0:
    uVar1 = *(uint *)(buf + offset);
    dVar4 = (double)(float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18);
    break;
  case 1:
    uVar1 = *(uint *)(buf + offset);
    dVar4 = (double)(int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18) * 9.5367431640625e-07;
    break;
  case 2:
    uVar1 = *(uint *)(buf + offset);
    *pValue = (double)CONCAT44((int)(short)((ushort)buf[(long)offset + 4] << 8) |
                               (uint)buf[(long)offset + 5],
                               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18) * 2.3283064365386963e-10;
    iVar3 = 6;
    goto LAB_00120bbf;
  case 3:
    uVar2 = *(ulong *)(buf + offset);
    *pValue = (double)(uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                       (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                       (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
    iVar3 = 8;
    goto LAB_00120bbf;
  }
  *pValue = dVar4;
  iVar3 = 4;
LAB_00120bbf:
  return iVar3 + offset;
}

Assistant:

inline int ConvertToDoubleMT(int OutputSettings, unsigned char* buf, int offset, double* pValue)
{
	usInt_MT usl;
	usShort_MT uss;
	uInt_MT ul;
	LARGE_INTEGER li;
	uDouble_MT ud;
	uFloat_MT uf;

	switch (OutputSettings & OUTPUT_FORMAT_MASK)
	{
	case OUTPUT_FORMAT_DOUBLE:
		ud.c[0] = buf[7+offset];
		ud.c[1] = buf[6+offset];
		ud.c[2] = buf[5+offset];
		ud.c[3] = buf[4+offset];
		ud.c[4] = buf[3+offset];
		ud.c[5] = buf[2+offset];
		ud.c[6] = buf[1+offset];
		ud.c[7] = buf[0+offset];
		*pValue = ud.v;
		return offset+8;
	case OUTPUT_FORMAT_FIXED_POINT_SIGNED_1632:
		uss.c[0] = buf[5+offset];
		uss.c[1] = buf[4+offset];
		ul.c[0] = buf[3+offset];
		ul.c[1] = buf[2+offset];
		ul.c[2] = buf[1+offset];
		ul.c[3] = buf[0+offset];
		li.HighPart = (int)uss.v;
		li.LowPart = ul.v;
		*pValue = (double)li.QuadPart/4294967296.0;
		return offset+6;
	case OUTPUT_FORMAT_FIXED_POINT_SIGNED_1220:
		usl.c[0] = buf[3+offset];
		usl.c[1] = buf[2+offset];
		usl.c[2] = buf[1+offset];
		usl.c[3] = buf[0+offset];
		*pValue = (double)usl.v/1048576.0;
		return offset+4;
	case OUTPUT_FORMAT_FLOAT:
	default:
		uf.c[0] = buf[3+offset];
		uf.c[1] = buf[2+offset];
		uf.c[2] = buf[1+offset];
		uf.c[3] = buf[0+offset];
		*pValue = (double)uf.v;
		return offset+4;
	}
}